

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

int consume_header(archive_read_filter *self)

{
  uint uVar1;
  archive_read_filter *filter;
  size_t sVar2;
  void *pvVar3;
  size_t in_RDI;
  int ret;
  size_t len;
  ssize_t avail;
  private_data_conflict *state;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  archive_read_filter *filter_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  filter_00 = *(archive_read_filter **)(in_RDI + 0x50);
  filter = (archive_read_filter *)
           peek_at_header(filter_00,
                          (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (filter == (archive_read_filter *)0x0) {
    iVar4 = 1;
  }
  else {
    __archive_read_filter_consume
              (filter,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    sVar2 = crc32(0);
    filter_00->client_total = sVar2;
    pvVar3 = __archive_read_filter_ahead
                       ((archive_read_filter *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                        &filter_00->position);
    filter_00->position = (int64_t)pvVar3;
    *(undefined4 *)&filter_00->bidder = in_stack_ffffffffffffffe0;
    uVar1 = inflateInit2_(filter_00,0xfffffff1,"1.2.11",0x70);
    switch(uVar1) {
    case 0:
      *(undefined1 *)&filter_00->buffer_size = 1;
      return 0;
    case 0xfffffffa:
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,
                        "Internal error initializing compression library: invalid library version");
      break;
    default:
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,
                        "Internal error initializing compression library:  Zlib error %d",
                        (ulong)uVar1);
      break;
    case 0xfffffffc:
      archive_set_error(*(archive **)(in_RDI + 0x18),0xc,
                        "Internal error initializing compression library: out of memory");
      break;
    case 0xfffffffe:
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,
                        "Internal error initializing compression library: invalid setup parameter");
    }
    iVar4 = -0x1e;
  }
  return iVar4;
}

Assistant:

static int
consume_header(struct archive_read_filter *self)
{
	struct private_data *state;
	ssize_t avail;
	size_t len;
	int ret;

	state = (struct private_data *)self->data;

	/* If this is a real header, consume it. */
	len = peek_at_header(self->upstream, NULL);
	if (len == 0)
		return (ARCHIVE_EOF);
	__archive_read_filter_consume(self->upstream, len);

	/* Initialize CRC accumulator. */
	state->crc = crc32(0L, NULL, 0);

	/* Initialize compression library. */
	state->stream.next_in = (unsigned char *)(uintptr_t)
	    __archive_read_filter_ahead(self->upstream, 1, &avail);
	state->stream.avail_in = (uInt)avail;
	ret = inflateInit2(&(state->stream),
	    -15 /* Don't check for zlib header */);

	/* Decipher the error code. */
	switch (ret) {
	case Z_OK:
		state->in_stream = 1;
		return (ARCHIVE_OK);
	case Z_STREAM_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid setup parameter");
		break;
	case Z_MEM_ERROR:
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Internal error initializing compression library: "
		    "out of memory");
		break;
	case Z_VERSION_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid library version");
		break;
	default:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    " Zlib error %d", ret);
		break;
	}
	return (ARCHIVE_FATAL);
}